

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseImportModuleField(WastParser *this,Module *module)

{
  FuncImport *pFVar1;
  long *plVar2;
  Result RVar3;
  Result RVar4;
  TokenType TVar5;
  Location *__args_1;
  long lVar6;
  __uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *__args;
  allocator<char> local_122;
  allocator<char> local_121;
  undefined1 local_120 [8];
  undefined1 local_118 [64];
  __uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  _Head_base<0UL,_wabt::FuncImport_*,_false> local_b8;
  string name;
  Location loc;
  string field_name;
  string module_name;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  CheckImportOrdering(this,module);
  RVar3 = Expect(this,Import);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  module_name._M_dataplus._M_p = (pointer)&module_name.field_2;
  module_name._M_string_length = 0;
  module_name.field_2._M_local_buf[0] = '\0';
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  RVar3.enum_ = Error;
  RVar4 = ParseQuotedText(this,&module_name,true);
  if (RVar4.enum_ == Error) goto LAB_00130a4e;
  RVar3.enum_ = Error;
  RVar4 = ParseQuotedText(this,&field_name,true);
  if ((RVar4.enum_ == Error) || (RVar4 = Expect(this,Lpar), RVar4.enum_ == Error))
  goto LAB_00130a4e;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  TVar5 = Peek(this,0);
  if (TVar5 == Tag) {
    Consume((Token *)local_118,this);
    ParseBindVarOpt(this,&name);
    std::make_unique<wabt::TagImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)(local_118._0_8_ + 0x70));
    if (((RVar3.enum_ == Error) ||
        (RVar3 = ParseUnboundFuncSignature(this,(FuncSignature *)(local_118._0_8_ + 0xc0)),
        RVar3.enum_ == Error)) || (RVar3 = Expect(this,Rpar), RVar3.enum_ == Error))
    goto LAB_00130a36;
    __args = &local_d8;
    __args_1 = (Location *)local_118;
    std::
    make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TagImport,std::default_delete<wabt::TagImport>>,wabt::Location&>
              ((unique_ptr<wabt::TagImport,_std::default_delete<wabt::TagImport>_> *)__args,__args_1
              );
LAB_00130ab8:
    pFVar1 = (((__uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
              &(__args->_M_t).
               super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>)->
             _M_t).
             super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
             super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl;
    plVar2 = (long *)(__args_1->filename)._M_len;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    std::__cxx11::string::_M_assign
              ((string *)
               (*(long *)((long)&(((ImportMixin<(wabt::ExternalKind)3> *)
                                  &pFVar1->super_ImportMixin<(wabt::ExternalKind)0>)->super_Import).
                                 field_name.field_2 + 8) + 8));
    std::__cxx11::string::_M_assign
              ((string *)
               (*(long *)((long)&(((ImportMixin<(wabt::ExternalKind)3> *)
                                  &pFVar1->super_ImportMixin<(wabt::ExternalKind)0>)->super_Import).
                                 field_name.field_2 + 8) + 0x28));
    local_b8._M_head_impl = pFVar1;
    Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&local_b8);
    if (local_b8._M_head_impl != (FuncImport *)0x0) {
      (*(((ImportMixin<(wabt::ExternalKind)3> *)
         &(local_b8._M_head_impl)->super_ImportMixin<(wabt::ExternalKind)0>)->super_Import).
        _vptr_Import[1])();
    }
    local_b8._M_head_impl = (FuncImport *)0x0;
    RVar3 = Expect(this,Rpar);
    RVar3.enum_ = (Enum)(RVar3.enum_ == Error);
  }
  else {
    if (TVar5 == Global) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      std::make_unique<wabt::GlobalImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      RVar3 = ParseGlobalType(this,(Global *)(local_118._0_8_ + 0x50));
      if ((RVar3.enum_ != Error) && (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error)) {
        __args = &local_d8;
        __args_1 = (Location *)local_118;
        std::
        make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location&>
                  ((unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> *)
                   __args,__args_1);
        goto LAB_00130ab8;
      }
    }
    else if (TVar5 == Memory) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      std::make_unique<wabt::MemoryImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      *(undefined4 *)(local_118._0_8_ + 0x88) = 0x10000;
      RVar3 = ParseLimitsIndex(this,(Limits *)(local_118._0_8_ + 0x70));
      if (((RVar3.enum_ != Error) &&
          (RVar3 = ParseLimits(this,(Limits *)(local_118._0_8_ + 0x70)), RVar3.enum_ != Error)) &&
         ((RVar3 = ParsePageSize(this,(uint32_t *)(local_118._0_8_ + 0x88)), RVar3.enum_ != Error &&
          (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error)))) {
        __args = &local_d8;
        __args_1 = (Location *)local_118;
        std::
        make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location&>
                  ((unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                   __args,__args_1);
        goto LAB_00130ab8;
      }
    }
    else if (TVar5 == Table) {
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      std::make_unique<wabt::TableImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      RVar3 = ParseLimitsIndex(this,(Limits *)(local_118._0_8_ + 0x70));
      if ((((RVar3.enum_ != Error) &&
           (RVar3 = ParseLimits(this,(Limits *)(local_118._0_8_ + 0x70)), RVar3.enum_ != Error)) &&
          (RVar3 = ParseRefType(this,(Type *)(local_118._0_8_ + 0x88)), RVar3.enum_ != Error)) &&
         (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error)) {
        __args = &local_d8;
        __args_1 = (Location *)local_118;
        std::
        make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location&>
                  ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)__args,
                   __args_1);
        goto LAB_00130ab8;
      }
    }
    else {
      if (TVar5 != First_RefKind) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_118,"an external kind",(allocator<char> *)local_120);
        local_d8._M_t.
        super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
        super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl =
             (tuple<wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>)
             (_Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>)0x0;
        uStack_d0 = 0;
        local_c8 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   (string *)local_118,local_118 + 0x20);
        RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_d8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d8);
        std::__cxx11::string::_M_dispose();
        goto LAB_00130a44;
      }
      Consume((Token *)local_118,this);
      ParseBindVarOpt(this,&name);
      std::make_unique<wabt::FuncImport,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
      RVar3 = ParseTypeUseOpt(this,(FuncDeclaration *)((long)local_120 + 0x70));
      local_118._0_8_ = local_120;
      if ((RVar3.enum_ != Error) &&
         (RVar3 = ParseFuncSignature(this,(FuncSignature *)((long)local_120 + 0xc0),
                                     (BindingHash *)((long)local_120 + 0x108)),
         local_118._0_8_ = local_120, RVar3.enum_ != Error)) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"param",&local_121);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_118 + 0x20),"result",&local_122);
        local_d8._M_t.
        super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
        super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl =
             (tuple<wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>)
             (_Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>)0x0;
        uStack_d0 = 0;
        local_c8 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   (string *)local_118,&local_d8);
        RVar3 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_d8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d8);
        lVar6 = 0x20;
        do {
          std::__cxx11::string::_M_dispose();
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != -0x20);
        local_118._0_8_ = local_120;
        if ((RVar3.enum_ != Error) &&
           (RVar3 = Expect(this,Rpar), local_118._0_8_ = local_120, RVar3.enum_ != Error)) {
          __args = (__uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
                   local_118;
          __args_1 = (Location *)local_120;
          std::
          make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location&>
                    ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)__args,
                     __args_1);
          goto LAB_00130ab8;
        }
      }
    }
LAB_00130a36:
    if ((long *)local_118._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_118._0_8_ + 8))();
    }
    RVar3.enum_ = Error;
  }
LAB_00130a44:
  std::__cxx11::string::_M_dispose();
LAB_00130a4e:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseImportModuleField(Module* module) {
  WABT_TRACE(ParseImportModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  CheckImportOrdering(module);
  EXPECT(Import);
  std::string module_name;
  std::string field_name;
  CHECK_RESULT(ParseQuotedText(&module_name));
  CHECK_RESULT(ParseQuotedText(&field_name));
  EXPECT(Lpar);

  std::unique_ptr<ImportModuleField> field;
  std::string name;

  switch (Peek()) {
    case TokenType::Func: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<FuncImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->func.decl));
      CHECK_RESULT(
          ParseFuncSignature(&import->func.decl.sig, &import->func.bindings));
      CHECK_RESULT(ErrorIfLpar({"param", "result"}));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Table: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TableImport>(name);
      CHECK_RESULT(ParseLimitsIndex(&import->table.elem_limits));
      CHECK_RESULT(ParseLimits(&import->table.elem_limits));
      CHECK_RESULT(ParseRefType(&import->table.elem_type));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Memory: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<MemoryImport>(name);
      import->memory.page_size = WABT_DEFAULT_PAGE_SIZE;
      CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
      CHECK_RESULT(ParseLimits(&import->memory.page_limits));
      CHECK_RESULT(ParsePageSize(&import->memory.page_size));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Global: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<GlobalImport>(name);
      CHECK_RESULT(ParseGlobalType(&import->global));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    case TokenType::Tag: {
      Consume();
      ParseBindVarOpt(&name);
      auto import = std::make_unique<TagImport>(name);
      CHECK_RESULT(ParseTypeUseOpt(&import->tag.decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&import->tag.decl.sig));
      EXPECT(Rpar);
      field = std::make_unique<ImportModuleField>(std::move(import), loc);
      break;
    }

    default:
      return ErrorExpected({"an external kind"});
  }

  field->import->module_name = module_name;
  field->import->field_name = field_name;

  module->AppendField(std::move(field));
  EXPECT(Rpar);
  return Result::Ok;
}